

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operands.c
# Opt level: O0

int GetInstModeSize(int Mode)

{
  int local_c;
  int Mode_local;
  
  switch(Mode) {
  case 6:
  case 7:
  case 8:
  case 10:
  case 0xb:
    local_c = 2;
    break;
  case 9:
    local_c = 4;
    break;
  case 0xc:
    if (Size == 4) {
      local_c = 4;
    }
    else {
      local_c = 2;
    }
    break;
  case 0xd:
    local_c = 0;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

int GetInstModeSize(int Mode)

/* Determines the size for the various instruction modes. */
{
	switch (Mode) {
	case ARDisp:
	case ARDisX:
	case PCDisp:
	case PCDisX:
	case AbsW:
		return (2);
	case AbsL:
		return (4);
	case MultiM:
		return (0); /* Accounted for by code generator */
	case Imm:
		if (Size == Long)
			return (4);
		else
			return (2);
	default:
		return (0);
	}
}